

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int fp_i2stat(fitsfile *infptr,int naxis,long *naxes,imgstats *imagestats,int *status)

{
  long lVar1;
  int *piVar2;
  fitsfile *pfVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  size_t __nmemb;
  short nullvalue;
  long *local_188;
  int *local_180;
  short maxvalue;
  short minvalue;
  long local_170;
  imgstats *local_168;
  fitsfile *local_160;
  double noise5;
  double noise3;
  double noise2;
  double noise1;
  double sigma;
  long ngood;
  int tstatus;
  int anynul;
  double mean;
  long lpixel [9];
  long fpixel [9];
  long inc [9];
  
  plVar10 = &DAT_0010a210;
  plVar11 = fpixel;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *plVar11 = *plVar10;
    plVar10 = plVar10 + 1;
    plVar11 = plVar11 + 1;
  }
  plVar10 = &DAT_0010a210;
  plVar11 = lpixel;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *plVar11 = *plVar10;
    plVar10 = plVar10 + 1;
    plVar11 = plVar11 + 1;
  }
  plVar10 = &DAT_0010a210;
  plVar11 = inc;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *plVar11 = *plVar10;
    plVar10 = plVar10 + 1;
    plVar11 = plVar11 + 1;
  }
  lVar6 = *naxes;
  lpixel[0] = (long)(XSAMPLE / 2) + lVar6 / 2;
  fpixel[0] = lVar6 / 2 - (long)(XSAMPLE / 2 + -1);
  if (fpixel[0] < 2) {
    fpixel[0] = 1;
  }
  if (lVar6 <= lpixel[0]) {
    lpixel[0] = lVar6;
  }
  lVar9 = (lpixel[0] - fpixel[0]) + 1;
  lVar6 = fpixel[0];
  lVar12 = lpixel[0];
  if (1 < naxis) {
    lVar1 = naxes[1];
    lVar12 = (long)(YSAMPLE / 2) + lVar1 / 2;
    lVar7 = lVar1 / 2 - (long)(YSAMPLE / 2 + -1);
    lVar6 = 1;
    if (1 < lVar7) {
      lVar6 = lVar7;
    }
    lpixel[1] = lVar12;
    fpixel[1] = lVar6;
    if (lVar1 <= lVar12) {
      lVar12 = lVar1;
      lpixel[1] = lVar1;
    }
  }
  lVar6 = (lVar12 - lVar6) + 1;
  __nmemb = lVar6 * lVar9;
  local_180 = (int *)CONCAT44(local_180._4_4_,naxis);
  if (2 < naxis) {
    lpixel[2] = naxes[2] / 2 + 1;
    fpixel[2] = lpixel[2];
  }
  local_160 = infptr;
  pvVar5 = calloc(__nmemb,2);
  pfVar3 = local_160;
  if (pvVar5 == (void *)0x0) {
    *status = 0x71;
    iVar4 = 0x71;
  }
  else {
    local_188 = naxes;
    local_170 = lVar9;
    local_168 = imagestats;
    ffpscl(0x3ff0000000000000,0,local_160,status);
    plVar10 = local_188;
    uVar8 = (ulong)local_180 & 0xffffffff;
    local_188 = (long *)pvVar5;
    local_180 = status;
    ffgsvi(pfVar3,0,uVar8,plVar10,fpixel,lpixel,inc,0,pvVar5,&anynul,status);
    tstatus = 0;
    ffgky(pfVar3,0x15,"BLANK",&nullvalue,0,&tstatus);
    piVar2 = local_180;
    plVar10 = local_188;
    if (tstatus != 0) {
      nullvalue = 0;
    }
    fits_img_stats_short
              (local_188,local_170,lVar6,tstatus == 0,(int)nullvalue,&ngood,&minvalue,&maxvalue,
               &mean,&sigma,&noise1,&noise2,&noise3,&noise5,local_180);
    local_168->n_nulls = (int)__nmemb - (int)ngood;
    local_168->minval = (double)(int)minvalue;
    local_168->maxval = (double)(int)maxvalue;
    local_168->mean = mean;
    local_168->sigma = sigma;
    local_168->noise1 = noise1;
    local_168->noise2 = noise2;
    local_168->noise3 = noise3;
    local_168->noise5 = noise5;
    free(plVar10);
    iVar4 = *piVar2;
  }
  return iVar4;
}

Assistant:

int fp_i2stat(fitsfile *infptr, int naxis, long *naxes, imgstats *imagestats, int *status)
{
/*
    read the central XSAMPLE by YSAMPLE region of pixels in the int*2 image, 
    and then compute basic statistics: min, max, mean, sigma, mean diff, etc.
*/

	long fpixel[9] = {1,1,1,1,1,1,1,1,1};
	long lpixel[9] = {1,1,1,1,1,1,1,1,1};
	long inc[9]    = {1,1,1,1,1,1,1,1,1};
	long i1, i2, npix, ngood, nx, ny;
	short *intarray, minvalue, maxvalue, nullvalue;
	int anynul, tstatus, checknull = 1;
	double mean, sigma, noise1, noise2, noise3, noise5;
	
         /* select the middle XSAMPLE by YSAMPLE area of the image */
	i1 = naxes[0]/2 - (XSAMPLE/2 - 1);
	i2 = naxes[0]/2 + (XSAMPLE/2);
	if (i1 < 1) i1 = 1;
	if (i2 > naxes[0]) i2 = naxes[0];
	fpixel[0] = i1;
	lpixel[0] = i2;
	nx = i2 - i1 +1;

        if (naxis > 1) {
	    i1 = naxes[1]/2 - (YSAMPLE/2 - 1);
	    i2 = naxes[1]/2 + (YSAMPLE/2);
	    if (i1 < 1) i1 = 1;
	    if (i2 > naxes[1]) i2 = naxes[1];
	    fpixel[1] = i1;
	    lpixel[1] = i2;
	}
	ny = i2 - i1 +1;

	npix = nx * ny;

        /* if there are higher dimensions, read the middle plane of the cube */
	if (naxis > 2) {
	    fpixel[2] = naxes[2]/2 + 1;
	    lpixel[2] = naxes[2]/2 + 1;
	}

	intarray = calloc(npix, sizeof(short));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr, 1.0, 0.0, status);

	fits_read_subset_sht(infptr, 0, naxis, naxes, fpixel, lpixel, inc,
	    0, intarray, &anynul, status);

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TSHORT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   nullvalue = 0;
	   checknull = 0;
	}

	/* compute statistics of the image */

        fits_img_stats_short(intarray, nx, ny, checknull, nullvalue, 
	&ngood, &minvalue, &maxvalue, &mean, &sigma, &noise1, &noise2, &noise3, &noise5, status);

	imagestats->n_nulls = npix - ngood;
	imagestats->minval = minvalue;
	imagestats->maxval = maxvalue; 
	imagestats->mean = mean; 
	imagestats->sigma = sigma; 
	imagestats->noise1 = noise1; 
	imagestats->noise2 = noise2; 
	imagestats->noise3 = noise3; 
	imagestats->noise5 = noise5; 
    
	free(intarray);
	return(*status);
}